

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool SignatureHashSchnorr<CTransaction>
               (uint256 *hash_out,ScriptExecutionData *execdata,CTransaction *tx_to,uint32_t in_pos,
               uint8_t hash_type,SigVersion sigversion,PrecomputedTransactionData *cache,
               MissingDataBehavior mdb)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  size_type sVar4;
  CTxOut *pCVar5;
  uint in_ECX;
  byte *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  int in_R9D;
  long in_FS_OFFSET;
  long in_stack_00000008;
  bool have_annex;
  uint8_t input_type;
  uint8_t output_type;
  uint8_t ext_flag;
  uint8_t spend_type;
  uint8_t key_version;
  HashWriter sha_single_output;
  HashWriter ss;
  undefined4 in_stack_fffffffffffffe98;
  MissingDataBehavior in_stack_fffffffffffffe9c;
  CTxOut *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  uint uVar6;
  bool local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined1 local_d8 [104];
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_R9D != 2) && (in_R9D != 3)) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x5d7,
                  "bool SignatureHashSchnorr(uint256 &, ScriptExecutionData &, const T &, uint32_t, uint8_t, SigVersion, const PrecomputedTransactionData &, MissingDataBehavior) [T = CTransaction]"
                 );
  }
  sVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                     CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  if (sVar4 <= in_ECX) {
    __assert_fail("in_pos < tx_to.vin.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x5d9,
                  "bool SignatureHashSchnorr(uint256 &, ScriptExecutionData &, const T &, uint32_t, uint8_t, SigVersion, const PrecomputedTransactionData &, MissingDataBehavior) [T = CTransaction]"
                 );
  }
  if (((*(byte *)(in_stack_00000008 + 0xa0) & 1) == 0) ||
     ((*(byte *)(in_stack_00000008 + 0x120) & 1) == 0)) {
    local_120 = HandleMissingData(in_stack_fffffffffffffe9c);
  }
  else {
    memcpy(local_70,&HASHER_TAPSIGHASH,0x68);
    HashWriter::operator<<
              ((HashWriter *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               (uchar *)in_stack_fffffffffffffea0);
    if (in_R8B == 0) {
      uVar6 = 1;
    }
    else {
      uVar6 = in_R8B & 3;
    }
    cVar2 = (char)uVar6;
    if ((in_R8B < 4) || ((0x80 < in_R8B && (in_R8B < 0x84)))) {
      HashWriter::operator<<
                ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                 (uchar *)in_stack_fffffffffffffea0);
      HashWriter::operator<<
                ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                 (uint *)in_stack_fffffffffffffea0);
      HashWriter::operator<<
                ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                 (uint *)in_stack_fffffffffffffea0);
      if ((in_R8B & 0x80) != 0x80) {
        HashWriter::operator<<
                  ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                   (uint256 *)in_stack_fffffffffffffea0);
        HashWriter::operator<<
                  ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                   (uint256 *)in_stack_fffffffffffffea0);
        HashWriter::operator<<
                  ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                   (uint256 *)in_stack_fffffffffffffea0);
        HashWriter::operator<<
                  ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                   (uint256 *)in_stack_fffffffffffffea0);
      }
      if (cVar2 == '\x01') {
        HashWriter::operator<<
                  ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                   (uint256 *)in_stack_fffffffffffffea0);
      }
      if ((in_RSI[0x28] & 1) == 0) {
        __assert_fail("execdata.m_annex_init",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                      ,0x5f8,
                      "bool SignatureHashSchnorr(uint256 &, ScriptExecutionData &, const T &, uint32_t, uint8_t, SigVersion, const PrecomputedTransactionData &, MissingDataBehavior) [T = CTransaction]"
                     );
      }
      bVar1 = in_RSI[0x29];
      HashWriter::operator<<
                ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                 (uchar *)in_stack_fffffffffffffea0);
      if ((in_R8B & 0x80) == 0x80) {
        std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                   CONCAT44(uVar6,in_stack_fffffffffffffea8),(size_type)in_stack_fffffffffffffea0);
        HashWriter::operator<<
                  ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                   (COutPoint *)in_stack_fffffffffffffea0);
        std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                   CONCAT44(uVar6,in_stack_fffffffffffffea8),(size_type)in_stack_fffffffffffffea0);
        HashWriter::operator<<
                  ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),in_stack_fffffffffffffea0
                  );
        std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                   CONCAT44(uVar6,in_stack_fffffffffffffea8),(size_type)in_stack_fffffffffffffea0);
        HashWriter::operator<<
                  ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                   (uint *)in_stack_fffffffffffffea0);
      }
      else {
        HashWriter::operator<<
                  ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                   (uint *)in_stack_fffffffffffffea0);
      }
      if ((bVar1 & 1) != 0) {
        HashWriter::operator<<
                  ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                   (uint256 *)in_stack_fffffffffffffea0);
      }
      if (cVar2 == '\x03') {
        in_stack_fffffffffffffea0 = (CTxOut *)(ulong)in_ECX;
        pCVar5 = (CTxOut *)
                 std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                           ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                            CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        if (pCVar5 <= in_stack_fffffffffffffea0) {
          local_120 = false;
          goto LAB_010270bd;
        }
        bVar3 = std::optional::operator_cast_to_bool
                          ((optional<uint256> *)
                           CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        if (!bVar3) {
          memset(local_d8,0,0x68);
          HashWriter::HashWriter
                    ((HashWriter *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                     CONCAT44(uVar6,in_stack_fffffffffffffea8),(size_type)in_stack_fffffffffffffea0)
          ;
          HashWriter::operator<<
                    ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                     in_stack_fffffffffffffea0);
          HashWriter::GetSHA256((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8));
          std::optional<uint256>::operator=
                    ((optional<uint256> *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                     (uint256 *)in_stack_fffffffffffffea0);
        }
        std::optional<uint256>::value
                  ((optional<uint256> *)CONCAT44(uVar6,in_stack_fffffffffffffea8));
        HashWriter::operator<<
                  ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                   (uint256 *)in_stack_fffffffffffffea0);
      }
      if (in_R9D == 3) {
        if ((*in_RSI & 1) == 0) {
          __assert_fail("execdata.m_tapleaf_hash_init",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                        ,0x614,
                        "bool SignatureHashSchnorr(uint256 &, ScriptExecutionData &, const T &, uint32_t, uint8_t, SigVersion, const PrecomputedTransactionData &, MissingDataBehavior) [T = CTransaction]"
                       );
        }
        HashWriter::operator<<
                  ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                   (uint256 *)in_stack_fffffffffffffea0);
        HashWriter::operator<<
                  ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                   (uchar *)in_stack_fffffffffffffea0);
        if ((in_RSI[0x21] & 1) == 0) {
          __assert_fail("execdata.m_codeseparator_pos_init",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                        ,0x617,
                        "bool SignatureHashSchnorr(uint256 &, ScriptExecutionData &, const T &, uint32_t, uint8_t, SigVersion, const PrecomputedTransactionData &, MissingDataBehavior) [T = CTransaction]"
                       );
        }
        HashWriter::operator<<
                  ((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8),
                   (uint *)in_stack_fffffffffffffea0);
      }
      HashWriter::GetSHA256((HashWriter *)CONCAT44(uVar6,in_stack_fffffffffffffea8));
      *in_RDI = local_118;
      in_RDI[1] = local_110;
      in_RDI[2] = local_108;
      in_RDI[3] = local_100;
      local_120 = true;
    }
    else {
      local_120 = false;
    }
  }
LAB_010270bd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_120;
  }
  __stack_chk_fail();
}

Assistant:

bool SignatureHashSchnorr(uint256& hash_out, ScriptExecutionData& execdata, const T& tx_to, uint32_t in_pos, uint8_t hash_type, SigVersion sigversion, const PrecomputedTransactionData& cache, MissingDataBehavior mdb)
{
    uint8_t ext_flag, key_version;
    switch (sigversion) {
    case SigVersion::TAPROOT:
        ext_flag = 0;
        // key_version is not used and left uninitialized.
        break;
    case SigVersion::TAPSCRIPT:
        ext_flag = 1;
        // key_version must be 0 for now, representing the current version of
        // 32-byte public keys in the tapscript signature opcode execution.
        // An upgradable public key version (with a size not 32-byte) may
        // request a different key_version with a new sigversion.
        key_version = 0;
        break;
    default:
        assert(false);
    }
    assert(in_pos < tx_to.vin.size());
    if (!(cache.m_bip341_taproot_ready && cache.m_spent_outputs_ready)) {
        return HandleMissingData(mdb);
    }

    HashWriter ss{HASHER_TAPSIGHASH};

    // Epoch
    static constexpr uint8_t EPOCH = 0;
    ss << EPOCH;

    // Hash type
    const uint8_t output_type = (hash_type == SIGHASH_DEFAULT) ? SIGHASH_ALL : (hash_type & SIGHASH_OUTPUT_MASK); // Default (no sighash byte) is equivalent to SIGHASH_ALL
    const uint8_t input_type = hash_type & SIGHASH_INPUT_MASK;
    if (!(hash_type <= 0x03 || (hash_type >= 0x81 && hash_type <= 0x83))) return false;
    ss << hash_type;

    // Transaction level data
    ss << tx_to.version;
    ss << tx_to.nLockTime;
    if (input_type != SIGHASH_ANYONECANPAY) {
        ss << cache.m_prevouts_single_hash;
        ss << cache.m_spent_amounts_single_hash;
        ss << cache.m_spent_scripts_single_hash;
        ss << cache.m_sequences_single_hash;
    }
    if (output_type == SIGHASH_ALL) {
        ss << cache.m_outputs_single_hash;
    }

    // Data about the input/prevout being spent
    assert(execdata.m_annex_init);
    const bool have_annex = execdata.m_annex_present;
    const uint8_t spend_type = (ext_flag << 1) + (have_annex ? 1 : 0); // The low bit indicates whether an annex is present.
    ss << spend_type;
    if (input_type == SIGHASH_ANYONECANPAY) {
        ss << tx_to.vin[in_pos].prevout;
        ss << cache.m_spent_outputs[in_pos];
        ss << tx_to.vin[in_pos].nSequence;
    } else {
        ss << in_pos;
    }
    if (have_annex) {
        ss << execdata.m_annex_hash;
    }

    // Data about the output (if only one).
    if (output_type == SIGHASH_SINGLE) {
        if (in_pos >= tx_to.vout.size()) return false;
        if (!execdata.m_output_hash) {
            HashWriter sha_single_output{};
            sha_single_output << tx_to.vout[in_pos];
            execdata.m_output_hash = sha_single_output.GetSHA256();
        }
        ss << execdata.m_output_hash.value();
    }

    // Additional data for BIP 342 signatures
    if (sigversion == SigVersion::TAPSCRIPT) {
        assert(execdata.m_tapleaf_hash_init);
        ss << execdata.m_tapleaf_hash;
        ss << key_version;
        assert(execdata.m_codeseparator_pos_init);
        ss << execdata.m_codeseparator_pos;
    }

    hash_out = ss.GetSHA256();
    return true;
}